

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bcm2835.c
# Opt level: O1

void bcm2835_aux_spi_writenb(char *tbuf,uint32_t len)

{
  uint *puVar1;
  int iVar2;
  uint32_t *puVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  uint32_t *puVar7;
  uint uVar8;
  uint32_t *puVar9;
  
  puVar3 = bcm2835_spi1;
  if (debug == '\0') {
    *bcm2835_spi1 = spi1_speed << 0x14 | 0x64840;
  }
  else {
    printf("bcm2835_peri_write paddr %p, value %08X\n",bcm2835_spi1);
  }
  if (debug == '\0') {
    puVar3[1] = 2;
  }
  else {
    printf("bcm2835_peri_write paddr %p, value %08X\n",puVar3 + 1,2);
  }
  if (len != 0) {
    puVar1 = puVar3 + 2;
    puVar9 = puVar3 + 8;
LAB_0010285b:
    do {
      if (debug == '\0') {
        if ((*puVar1 >> 10 & 1) != 0) goto LAB_0010285b;
      }
      else {
        printf("bcm2835_peri_read  paddr %p\n",puVar1);
      }
      uVar4 = 3;
      if (len < 3) {
        uVar4 = len;
      }
      uVar6 = 0;
      iVar5 = 0x10;
      do {
        if ((byte *)tbuf == (byte *)0x0) {
          tbuf = (char *)0x0;
          uVar8 = 0;
        }
        else {
          uVar8 = (uint)(byte)*tbuf;
          tbuf = (char *)((byte *)tbuf + 1);
        }
        uVar6 = uVar6 | uVar8 << ((byte)iVar5 & 0x1f);
        iVar2 = (uVar4 + (uVar4 == 0)) * 8 + iVar5;
        iVar5 = iVar5 + -8;
      } while (iVar2 != 0x18);
      uVar6 = uVar6 | uVar4 << 0x1b;
      len = len - uVar4;
      if (len == 0) {
        puVar7 = puVar9;
        if (debug != '\0') goto LAB_001028f2;
        *puVar9 = uVar6;
      }
      else {
        puVar7 = puVar3 + 0xc;
        if (debug == '\0') {
          puVar3[0xc] = uVar6;
        }
        else {
LAB_001028f2:
          printf("bcm2835_peri_write paddr %p, value %08X\n",puVar7);
        }
      }
      do {
        if (debug != '\0') {
          printf("bcm2835_peri_read  paddr %p\n",puVar1);
          break;
        }
      } while ((*puVar1 & 0x40) != 0);
      if (debug != '\0') {
        printf("bcm2835_peri_read  paddr %p\n",puVar9);
      }
    } while (len != 0);
  }
  return;
}

Assistant:

void bcm2835_aux_spi_writenb(const char *tbuf, uint32_t len) {
    volatile uint32_t* cntl0 = bcm2835_spi1 + BCM2835_AUX_SPI_CNTL0/4;
    volatile uint32_t* cntl1 = bcm2835_spi1 + BCM2835_AUX_SPI_CNTL1/4;
    volatile uint32_t* stat = bcm2835_spi1 + BCM2835_AUX_SPI_STAT/4;
    volatile uint32_t* txhold = bcm2835_spi1 + BCM2835_AUX_SPI_TXHOLD/4;
    volatile uint32_t* io = bcm2835_spi1 + BCM2835_AUX_SPI_IO/4;

    char *tx = (char *) tbuf;
    uint32_t tx_len = len;
    uint32_t count;
    uint32_t data;
    uint32_t i;
    uint8_t byte;

    uint32_t _cntl0 = (spi1_speed << BCM2835_AUX_SPI_CNTL0_SPEED_SHIFT);
    _cntl0 |= BCM2835_AUX_SPI_CNTL0_CS2_N;
    _cntl0 |= BCM2835_AUX_SPI_CNTL0_ENABLE;
    _cntl0 |= BCM2835_AUX_SPI_CNTL0_MSBF_OUT;
    _cntl0 |= BCM2835_AUX_SPI_CNTL0_VAR_WIDTH;

    bcm2835_peri_write(cntl0, _cntl0);
    bcm2835_peri_write(cntl1, BCM2835_AUX_SPI_CNTL1_MSBF_IN);

    while (tx_len > 0) {

	while (bcm2835_peri_read(stat) & BCM2835_AUX_SPI_STAT_TX_FULL)
	    ;

	count = MIN(tx_len, 3);
	data = 0;

	for (i = 0; i < count; i++) {
	    byte = (tx != NULL) ? (uint8_t) *tx++ : (uint8_t) 0;
	    data |= byte << (8 * (2 - i));
	}

	data |= (count * 8) << 24;
	tx_len -= count;

	if (tx_len != 0) {
	    bcm2835_peri_write(txhold, data);
	} else {
	    bcm2835_peri_write(io, data);
	}

	while (bcm2835_peri_read(stat) & BCM2835_AUX_SPI_STAT_BUSY)
	    ;

	(void) bcm2835_peri_read(io);
    }
}